

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O3

Gia_Man_t * Acb_NtkGiaDeriveDual(Acb_Ntk_t *p)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vCopies;
  int *__s;
  Gia_Man_t *p_00;
  char *__s_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *vTemp;
  int *piVar8;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar9;
  long lVar10;
  
  iVar1 = (p->vObjType).nSize;
  lVar10 = (long)iVar1 * 2 + -2;
  vCopies = (Vec_Int_t *)malloc(0x10);
  uVar4 = (uint)lVar10;
  uVar5 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar5 = uVar4;
  }
  vCopies->nCap = uVar5;
  if (uVar5 == 0) {
    vCopies->pArray = (int *)0x0;
    vCopies->nSize = uVar4;
  }
  else {
    __s = (int *)malloc((long)(int)uVar5 << 2);
    vCopies->pArray = __s;
    vCopies->nSize = uVar4;
    if (__s != (int *)0x0) {
      memset(__s,0xff,lVar10 * 4);
      goto LAB_003acea8;
    }
  }
  __s = (int *)0x0;
LAB_003acea8:
  p_00 = Gia_ManStart((iVar1 + -1) * 5);
  __s_00 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (__s_00 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s_00);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s_00);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  if (1 < iVar1) {
    __s[0] = 0;
    __s[1] = 0;
    if (0 < (p->vCis).nSize) {
      lVar10 = 0;
      do {
        iVar1 = (p->vCis).pArray[lVar10];
        if ((iVar1 < 0) || (uVar5 = iVar1 * 2, uVar4 <= uVar5)) goto LAB_003ad168;
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_003ad187:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_003ad187;
        __s[uVar5] = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
        __s[(ulong)uVar5 + 1] = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < (p->vCis).nSize);
    }
    vTemp = (Vec_Int_t *)malloc(0x10);
    vTemp->nCap = 0x10;
    vTemp->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    vTemp->pArray = piVar8;
    __ptr = Acb_NtkFindNodes2(p);
    if (0 < __ptr->nSize) {
      lVar10 = 0;
      do {
        iVar1 = __ptr->pArray[lVar10];
        if ((iVar1 < 0) || (uVar4 <= (uint)(iVar1 * 2))) goto LAB_003ad168;
        Acb_ObjToGiaDual(p_00,p,iVar1,vTemp,vCopies,__s + (uint)(iVar1 * 2));
        lVar10 = lVar10 + 1;
      } while (lVar10 < __ptr->nSize);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (vTemp->pArray != (int *)0x0) {
      free(vTemp->pArray);
    }
    free(vTemp);
    if (0 < (p->vCos).nSize) {
      lVar10 = 0;
      do {
        iVar1 = (p->vCos).pArray[lVar10];
        if ((long)iVar1 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
        }
        if ((p->vObjFans).nSize <= iVar1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vObjFans).pArray[iVar1];
        if (((((long)iVar1 < 0) || ((p->vFanSto).nSize <= iVar1)) ||
            (iVar1 = (p->vFanSto).pArray[(long)iVar1 + 1], iVar1 < 0)) ||
           (uVar5 = iVar1 * 2, uVar4 <= uVar5)) goto LAB_003ad168;
        Gia_ManAppendCo(p_00,__s[uVar5]);
        Gia_ManAppendCo(p_00,__s[(ulong)uVar5 + 1]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < (p->vCos).nSize);
    }
    free(__s);
    free(vCopies);
    pGVar9 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar9;
  }
LAB_003ad168:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveDual( Acb_Ntk_t * p )
{
    extern Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p );
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    Vec_Int_t * vCopies = Vec_IntStartFull( 2*Acb_NtkObjNum(p) );
    int i, iObj, * pLits;
    pNew = Gia_ManStart( 5 * Acb_NtkObjNum(p) );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    pLits = Vec_IntEntryP( vCopies, 0 );
    pLits[0] = 0;
    pLits[1] = 0;
    Acb_NtkForEachCi( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        pLits[0] = Gia_ManAppendCi(pNew);
        pLits[1] = 0;
    }
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        Acb_ObjToGiaDual( pNew, p, iObj, vFanins, vCopies, pLits );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*Acb_ObjFanin(p, iObj, 0) );
        Gia_ManAppendCo( pNew, pLits[0] );
        Gia_ManAppendCo( pNew, pLits[1] );
    }
    Vec_IntFree( vCopies );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}